

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O2

void google::protobuf::json_internal::ParseProto2Descriptor::SetFloat(Field f,Msg *msg,float x)

{
  bool bVar1;
  Metadata MVar2;
  
  RecordAsSeen(f,msg);
  bVar1 = FieldDescriptor::is_repeated(f);
  MVar2 = Message::GetMetadata(msg->msg_);
  if (bVar1) {
    Reflection::AddFloat(MVar2.reflection,msg->msg_,f,x);
    return;
  }
  Reflection::SetFloat(MVar2.reflection,msg->msg_,f,x);
  return;
}

Assistant:

static void SetFloat(Field f, Msg& msg, float x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddFloat(msg.msg_, f, x);
    } else {
      msg.msg_->GetReflection()->SetFloat(msg.msg_, f, x);
    }
  }